

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

bool QtPrivate::QLessThanOperatorForType<QList<bool>,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  difference_type __diff2;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar2 = *(long *)((long)b + 8);
  lVar3 = *(long *)((long)b + 0x10);
  lVar5 = *(long *)((long)a + 0x10);
  if (lVar3 < *(long *)((long)a + 0x10)) {
    lVar5 = lVar3;
  }
  lVar4 = lVar2;
  if (lVar5 != 0) {
    lVar4 = lVar2 + lVar5;
    lVar6 = 0;
    do {
      bVar1 = *(byte *)(*(long *)((long)a + 8) + lVar6);
      if (*(byte *)(lVar2 + lVar6) != bVar1) {
        return bVar1 < *(byte *)(lVar2 + lVar6);
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return lVar4 != lVar2 + lVar3;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }